

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall HMMSegmentTest_Test1_Test::TestBody(HMMSegmentTest_Test1_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words_1;
  char *res_1 [5];
  char *str_1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  char *res [8];
  char *str;
  HMMSegment segment;
  HMMSegment *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_stack_fffffffffffffd98;
  int iVar2;
  char *expected_expression;
  HMMSegment *in_stack_fffffffffffffda0;
  pointer file;
  allocator_type *in_stack_fffffffffffffda8;
  Type TVar3;
  allocator_type *__a;
  allocator<char> *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  undefined1 uVar4;
  HMMSegment *in_stack_fffffffffffffdc0;
  HMMSegment *this_01;
  Message *message;
  AssertHelper *this_02;
  char local_201 [25];
  AssertionResult local_1e8;
  allocator_type local_1d1;
  string local_1d0 [56];
  char *local_198;
  char *pcStack_190;
  char *local_188;
  char *pcStack_180;
  char *local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170 [3];
  AssertionResult local_128;
  undefined8 local_111;
  char *local_d8;
  char *pcStack_d0;
  char *local_c8;
  char *pcStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  undefined1 local_98 [31];
  undefined8 local_79;
  
  this_02 = (AssertHelper *)&local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdc0,
             (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0);
  cppjieba::HMMSegment::HMMSegment(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string((string *)((long)&local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_98._0_8_ = anon_var_dwarf_75c74;
  local_a8 = anon_var_dwarf_75cb9;
  pcStack_a0 = anon_var_dwarf_75c74 + 0x2a;
  local_b8 = anon_var_dwarf_760fd + 0x2c;
  pcStack_b0 = anon_var_dwarf_760fd + 0x2c;
  local_c8 = anon_var_dwarf_75dc0 + 0xf;
  pcStack_c0 = anon_var_dwarf_760fd + 0x2c;
  local_d8 = anon_var_dwarf_75c8d;
  pcStack_d0 = anon_var_dwarf_75c98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c9a25);
  message = (Message *)&local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdc0,
             (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0);
  cppjieba::HMMSegment::Cut
            (in_stack_fffffffffffffdc0,
             (string *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string((string *)((long)&local_111 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  this_01 = (HMMSegment *)local_98;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1c9ab5);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01,(char **)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             (char **)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  TVar3 = (Type)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((char *)in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd80);
  iVar2 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd90);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1c9b1d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  uVar4 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffdb0 =
         (allocator<char> *)testing::AssertionResult::failure_message((AssertionResult *)0x1c9c52);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffdb0,TVar3,(char *)in_stack_fffffffffffffda0,
               iVar2,(char *)in_stack_fffffffffffffd90);
    testing::internal::AssertHelper::operator=(this_02,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
    testing::Message::~Message((Message *)0x1c9caf);
  }
  local_170[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c9d1d);
  if (local_170[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    local_170[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd90);
  if (local_170[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    local_170[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x215c7a;
    local_178 = "123";
    local_188 = "1.2";
    pcStack_180 = ",";
    local_198 = "IBM";
    pcStack_190 = ",";
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1c9d9c);
    __a = &local_1d1;
    file = local_170[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (char *)CONCAT17(uVar4,in_stack_fffffffffffffdb8),in_stack_fffffffffffffdb0);
    cppjieba::HMMSegment::Cut
              (this_01,(string *)CONCAT17(uVar4,in_stack_fffffffffffffdb8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    this_00 = local_170;
    expected_expression = local_201;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1c9e2c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<char_const**,void>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_01,(char **)CONCAT17(uVar4,in_stack_fffffffffffffdb8),
               (char **)in_stack_fffffffffffffdb0,__a);
    TVar3 = (Type)((ulong)__a >> 0x20);
    testing::internal::EqHelper<false>::
    Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (expected_expression,(char *)this_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd80);
    iVar2 = (int)((ulong)expected_expression >> 0x20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1c9e94);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffd80 =
           (HMMSegment *)testing::AssertionResult::failure_message((AssertionResult *)0x1c9f9c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffdb0,TVar3,(char *)file,iVar2,(char *)this_00)
      ;
      testing::internal::AssertHelper::operator=(this_02,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
      testing::Message::~Message((Message *)0x1c9fea);
    }
    local_170[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca04f);
    if (local_170[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      local_170[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    if (local_170[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      local_170[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
  }
  cppjieba::HMMSegment::~HMMSegment(in_stack_fffffffffffffd80);
  return;
}

Assistant:

TEST(HMMSegmentTest, Test1) {
  HMMSegment segment("../dict/hmm_model.utf8");;
  {
    const char* str = "我来自北京邮电大学。。。学号123456";
    const char* res[] = {"我来", "自北京", "邮电大学", "。", "。", "。", "学号", "123456"};
    vector<string> words;
    segment.Cut(str, words);
    ASSERT_EQ(words, vector<string>(res, res + sizeof(res)/sizeof(res[0])));
  }

  {
    const char* str = "IBM,1.2,123";
    const char* res[] = {"IBM", ",", "1.2", ",", "123"};
    vector<string> words;
    segment.Cut(str, words);
    ASSERT_EQ(words, vector<string>(res, res + sizeof(res)/sizeof(res[0])));
  }
}